

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

ssize_t __thiscall Buffers::read(Buffers *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__dest;
  Buffers *pBVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  void *__src;
  void *__n;
  
  if (__buf == (void *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    while (pBVar1 = (Buffers *)
                    (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                    super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
                    super__List_node_base._M_next, pBVar1 != this) {
      __n = (void *)(pBVar1->mBufferOffset - this->mBufferOffset);
      __dest = (void *)(CONCAT44(in_register_00000034,__fd) + sVar2);
      __src = (void *)(this->mBufferOffset +
                      (pBVar1->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                      super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node._M_size);
      if (__buf < __n || (void *)((long)__buf - (long)__n) == (void *)0x0) {
        memcpy(__dest,__src,(size_t)__buf);
        if (__buf == __n) {
          this->mBufferOffset = 0;
          std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::pop_front
                    ((list<Buffer,_std::allocator<Buffer>_> *)this);
        }
        else {
          this->mBufferOffset = this->mBufferOffset + (long)__buf;
        }
        return sVar2 + (long)__buf;
      }
      memcpy(__dest,__src,(size_t)__n);
      this->mBufferOffset = 0;
      if ((Buffers *)
          (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
          super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.super__List_node_base.
          _M_next == this) {
        __assert_fail("!mBuffers.isEmpty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Buffer.h"
                      ,0x8f,"size_t Buffers::read(void *, size_t)");
      }
      std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::pop_front
                ((list<Buffer,_std::allocator<Buffer>_> *)this);
      sVar2 = sVar2 + (long)__n;
      __buf = (void *)((long)__buf - (long)__n);
    }
  }
  return sVar2;
}

Assistant:

size_t read(void *outPtr, size_t size)
    {
        if (!size)
            return 0;

        unsigned char *out = static_cast<unsigned char *>(outPtr);
        size_t read = 0, remaining = size;
        while (!mBuffers.empty()) {
            const auto &buf = mBuffers.front();
            const size_t bufferSize = buf.size() - mBufferOffset;

            if (remaining <= bufferSize) {
                memcpy(out + read, buf.data() + mBufferOffset, remaining);
                if (remaining == bufferSize) {
                    mBufferOffset = 0;
                    mBuffers.pop_front();
                } else {
                    mBufferOffset = remaining + mBufferOffset;
                }
                read += remaining;
                break;
            }
            memcpy(out + read, buf.data() + mBufferOffset, bufferSize);
            read += bufferSize;
            mBufferOffset = 0;
            remaining -= bufferSize;
            assert(!mBuffers.isEmpty());
            mBuffers.pop_front();
        }
        return read;
    }